

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O2

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_TypedTest_x_iutest_x_Mul2_Test,_iutest::detail::VariadicTypeList<int,_long,_short>_>
::EachTest<iutest::detail::VariadicTypeList<short>,_void>::EachTest
          (EachTest<iutest::detail::VariadicTypeList<short>,_void> *this,string *testsuite,
          char *name,size_t index,char *file,int line)

{
  TestSuite *pTVar1;
  allocator<char> local_39;
  string local_38;
  
  pTVar1 = AddTestSuite(testsuite,index,file,line);
  (this->m_mediator).super_iuITestSuiteMediator.m_test_suite = pTVar1;
  (this->m_mediator).super_iuITestSuiteMediator._vptr_iuITestSuiteMediator =
       (_func_int **)&PTR__iuITestSuiteMediator_0038bf60;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
  TestInfo::TestInfo(&this->m_info,(iuITestSuiteMediator *)this,&local_38,
                     &(this->m_factory).super_iuFactoryBase);
  std::__cxx11::string::~string((string *)&local_38);
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_0039a208;
  return;
}

Assistant:

EachTest(const ::std::string& testsuite, const char* name, size_t index, const char* file, int line)
            : m_mediator(AddTestSuite(testsuite, index, file, line))
            , m_info(&m_mediator, name, &m_factory)
            , m_next(testsuite, name, index+1, file, line)
        {
        }